

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O1

void __thiscall Assimp::Q3BSPFileParser::getLumps(Q3BSPFileParser *this)

{
  size_t sVar1;
  sQ3BSPLump *psVar2;
  size_t idx;
  long lVar3;
  
  sVar1 = this->m_sOffset;
  std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::resize
            (&this->m_pModel->m_Lumps,0x11);
  lVar3 = 0;
  do {
    psVar2 = (sQ3BSPLump *)operator_new(8);
    *psVar2 = *(sQ3BSPLump *)
               ((this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar3 * 8 + sVar1);
    (this->m_pModel->m_Lumps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar3] = psVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x11);
  return;
}

Assistant:

void Q3BSPFileParser::getLumps()
{
    size_t Offset = m_sOffset;
    m_pModel->m_Lumps.resize( kMaxLumps );
    for ( size_t idx=0; idx < kMaxLumps; idx++ )
    {
        sQ3BSPLump *pLump = new sQ3BSPLump;
        memcpy( pLump, &m_Data[ Offset ], sizeof( sQ3BSPLump ) );
        Offset += sizeof( sQ3BSPLump );
        m_pModel->m_Lumps[ idx ] = pLump;
    }
}